

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O3

void __thiscall primesieve::iterator::generate_next_primes(iterator *this)

{
  unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_> *this_00;
  size_t sVar1;
  PrimeGenerator *pPVar2;
  
  this_00 = &this->primeGenerator_;
  while( true ) {
    pPVar2 = (this_00->_M_t).
             super___uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_primesieve::PrimeGenerator_*,_std::default_delete<primesieve::PrimeGenerator>_>
             .super__Head_base<0UL,_primesieve::PrimeGenerator_*,_false>._M_head_impl;
    if (pPVar2 == (PrimeGenerator *)0x0) {
      IteratorHelper::next(&this->start_,&this->stop_,this->stop_hint_,&this->dist_);
      pPVar2 = (PrimeGenerator *)operator_new(0xb30);
      PrimeGenerator::PrimeGenerator(pPVar2,this->start_,this->stop_);
      std::
      __uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
      ::reset((__uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
               *)this_00,pPVar2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->primes_,0x100);
      pPVar2 = (this_00->_M_t).
               super___uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_primesieve::PrimeGenerator_*,_std::default_delete<primesieve::PrimeGenerator>_>
               .super__Head_base<0UL,_primesieve::PrimeGenerator_*,_false>._M_head_impl;
    }
    PrimeGenerator::fill(pPVar2,&this->primes_,&this->last_idx_);
    sVar1 = this->last_idx_;
    if (sVar1 != 0) break;
    std::
    __uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>::
    reset((__uniq_ptr_impl<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
           *)this_00,(pointer)0x0);
  }
  this->i_ = 0;
  this->last_idx_ = sVar1 - 1;
  return;
}

Assistant:

void iterator::generate_next_primes()
{
  while (true)
  {
    if (!primeGenerator_)
    {
      IteratorHelper::next(&start_, &stop_, stop_hint_, &dist_);
      auto p = new PrimeGenerator(start_, stop_);
      primeGenerator_.reset(p);
      primes_.resize(256);
    }

    primeGenerator_->fill(primes_, &last_idx_);

    // There are 3 different cases here:
    // 1) The primes array contains a few primes (<= 256).
    //    In this case we return the primes to the user.
    // 2) The primes array is empty because the next
    //    prime > stop. In this case we reset the
    //    primeGenerator object, increase the start & stop
    //    numbers and sieve the next segment.
    // 3) The next prime > 2^64. In this case the primes
    //    array contains an error code (UINT64_MAX) which
    //    is returned to the user.
    if (last_idx_ == 0)
      clear(primeGenerator_);
    else
      break;
  }

  i_ = 0;
  last_idx_--;
}